

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::PythonGenerator::ModuleFor<flatbuffers::EnumDef>
          (string *__return_storage_ptr__,PythonGenerator *this,EnumDef *def)

{
  string *filepath;
  Parser *pPVar1;
  size_t __n;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  size_type *psVar7;
  size_type sVar8;
  string filename;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((((this->super_BaseGenerator).parser_)->opts).one_file == false) {
    IdlNamer::NamespacedType_abi_cxx11_(__return_storage_ptr__,&this->namer_,&def->super_Definition)
    ;
  }
  else {
    filepath = &(def->super_Definition).file;
    StripExtension(&local_70,filepath);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,
                                (ulong)(((this->super_BaseGenerator).parser_)->opts).filename_suffix
                                       ._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50.field_2._8_8_ = plVar6[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_50._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pPVar1 = (this->super_BaseGenerator).parser_;
    __n = (pPVar1->file_being_parsed_)._M_string_length;
    if ((__n == (def->super_Definition).file._M_string_length) &&
       ((__n == 0 ||
        (iVar5 = bcmp((pPVar1->file_being_parsed_)._M_dataplus._M_p,(filepath->_M_dataplus)._M_p,__n
                     ), iVar5 == 0)))) {
      StripPath(&local_70,&local_50);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x38553a);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar7) {
        lVar4 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::operator+(__return_storage_ptr__,&(pPVar1->opts).include_prefix,&local_50);
      sVar2 = __return_storage_ptr__->_M_string_length;
      if (sVar2 != 0) {
        pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
        sVar8 = 0;
        do {
          if (pcVar3[sVar8] == '/') {
            pcVar3[sVar8] = '.';
          }
          sVar8 = sVar8 + 1;
        } while (sVar2 != sVar8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleFor(const T *def) const {
    if (!parser_.opts.one_file) {
      return namer_.NamespacedType(*def);
    }

    std::string filename =
        StripExtension(def->file) + parser_.opts.filename_suffix;
    if (parser_.file_being_parsed_ == def->file) {
      return "." + StripPath(filename);  // make it a "local" import
    }

    std::string module = parser_.opts.include_prefix + filename;
    std::replace(module.begin(), module.end(), '/', '.');
    return module;
  }